

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void __thiscall clickhouse::ZeroCopyOutput::DoWrite(ZeroCopyOutput *this,void *data,size_t len)

{
  size_t __n;
  long in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t result;
  void *ptr;
  void *local_20;
  long local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  while ((local_18 != 0 &&
         (__n = (**(code **)(*in_RDI + 0x20))(in_RDI,&local_20,local_18), __n != 0))) {
    memcpy(local_20,local_10,__n);
    local_18 = local_18 - __n;
    local_10 = (void *)((long)local_10 + __n);
  }
  return;
}

Assistant:

void ZeroCopyOutput::DoWrite(const void* data, size_t len) {
    while (len > 0) {
        void* ptr;
        size_t result = DoNext(&ptr, len);

        if (result) {
            memcpy(ptr, data, result);
            len -= result;
            data = static_cast<const uint8_t*>(data) + result;
        } else {
            break;
        }
    }
}